

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScapeGoatTree.cpp
# Opt level: O0

void __thiscall ScapeGoatTree::find(ScapeGoatTree *this,int value,Node **par,Node **loc)

{
  Node *local_38;
  Node *ptrSave;
  Node *ptr;
  Node **loc_local;
  Node **par_local;
  int value_local;
  ScapeGoatTree *this_local;
  
  if (this->root == (Node *)0x0) {
    *loc = (Node *)0x0;
    *par = (Node *)0x0;
  }
  else if (value == this->root->value) {
    *loc = this->root;
    *par = (Node *)0x0;
  }
  else {
    if (value < this->root->value) {
      ptrSave = this->root->leftChild;
    }
    else {
      ptrSave = this->root->rightChild;
    }
    local_38 = this->root;
    while (ptrSave != (Node *)0x0) {
      if (value == ptrSave->value) {
        *loc = ptrSave;
        *par = local_38;
        return;
      }
      local_38 = ptrSave;
      if (value < ptrSave->value) {
        ptrSave = ptrSave->leftChild;
      }
      else {
        ptrSave = ptrSave->rightChild;
      }
    }
    *loc = (Node *)0x0;
    *par = local_38;
  }
  return;
}

Assistant:

void ScapeGoatTree::find(int value, Node **par, Node **loc) {
    Node *ptr, *ptrSave;
    if (root == nullptr) {
        *loc = nullptr;
        *par = nullptr;
        return;
    }
    if (value == root->value) {
        *loc = root;
        *par = nullptr;
        return;
    }
    if (value < root->value) {
        ptr = root->leftChild;
    } else {
        ptr = root->rightChild;
    }
    ptrSave = root;
    while (ptr != nullptr) {
        if (value == ptr->value) {
            *loc = ptr;
            *par = ptrSave;
            return;
        }
        ptrSave = ptr;
        if (value < ptr->value) {
            ptr = ptr->leftChild;
        } else {
            ptr = ptr->rightChild;
        }
    }
    *loc = nullptr;
    *par = ptrSave;
}